

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_divw(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 pTVar1;
  TCGv_i32 pTVar2;
  code *func;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGv_i32 local_38;
  
  tcg_ctx = s->uc->tcg_ctx;
  pTVar1 = gen_ea_mode(env,s,insn >> 3 & 7,insn & 7,1,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,
                       ((insn >> 8 & 1) != 0) + EA_LOADU,
                       (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar1 != tcg_ctx->NULL_QREG) {
    pTVar2 = tcg_const_i32_m68k(tcg_ctx,insn >> 9 & 7);
    local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_38 = pTVar1 + (long)tcg_ctx;
    if ((insn >> 8 & 1) == 0) {
      func = helper_divuw_m68k;
    }
    else {
      func = helper_divsw_m68k;
    }
    local_40 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    tcg_gen_callN_m68k(tcg_ctx,func,(TCGTemp *)0x0,3,&local_48);
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    set_cc_op(s,CC_OP_FLAGS);
    return;
  }
  gen_exception(s,(s->base).pc_next,3);
  return;
}

Assistant:

DISAS_INSN(divw)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int sign;
    TCGv src;
    TCGv destr;

    /* divX.w <EA>,Dn    32/16 -> 16r:16q */

    sign = (insn & 0x100) != 0;

    /* dest.l / src.w */

    SRC_EA(env, src, OS_WORD, sign, NULL);
    destr = tcg_const_i32(tcg_ctx, REG(insn, 9));
    if (sign) {
        gen_helper_divsw(tcg_ctx, tcg_ctx->cpu_env, destr, src);
    } else {
        gen_helper_divuw(tcg_ctx, tcg_ctx->cpu_env, destr, src);
    }
    tcg_temp_free(tcg_ctx, destr);

    set_cc_op(s, CC_OP_FLAGS);
}